

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_hintmap_build(CF2_HintMap hintmap,CF2_ArrStack hStemHintArray,CF2_ArrStack vStemHintArray,
                      CF2_HintMask hintMask,CF2_F16Dot16 hintOrigin,FT_Bool initialMap)

{
  ulong uVar1;
  int iVar2;
  CF2_Font font;
  size_t sVar3;
  ulong uVar4;
  FT_Long FVar5;
  long *plVar6;
  FT_Bool *pFVar7;
  undefined1 *puVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t bitCount;
  long lVar15;
  uint uVar16;
  undefined7 in_register_00000089;
  uint uVar17;
  size_t *psVar18;
  uint uVar19;
  CF2_HintRec *pCVar20;
  bool bVar21;
  undefined1 auStack_f8 [8];
  CF2_HintMaskRec tempHintMask;
  undefined1 auStack_b8 [8];
  CF2_HintRec topHintEdge;
  undefined1 auStack_88 [8];
  CF2_HintRec dummy;
  
  font = hintmap->font;
  if (((int)CONCAT71(in_register_00000089,initialMap) == 0) &&
     (hintmap->initialHintMap->isValid == '\0')) {
    auStack_f8 = (undefined1  [8])hintMask->error;
    tempHintMask.bitCount = 0;
    tempHintMask.byteCount = 0;
    tempHintMask.error = (FT_Error *)0x0;
    tempHintMask.isValid = '\0';
    tempHintMask.isNew = '\0';
    tempHintMask._10_6_ = 0;
    tempHintMask.mask[0] = '\0';
    tempHintMask.mask[1] = '\0';
    tempHintMask.mask[2] = '\0';
    tempHintMask.mask[3] = '\0';
    tempHintMask.mask[4] = '\0';
    tempHintMask.mask[5] = '\0';
    tempHintMask.mask[6] = '\0';
    tempHintMask.mask[7] = '\0';
    cf2_hintmap_build(hintmap->initialHintMap,hStemHintArray,vStemHintArray,(CF2_HintMask)auStack_f8
                      ,hintOrigin,'\x01');
  }
  if (hintMask->isValid == '\0') {
    bitCount = vStemHintArray->count + hStemHintArray->count;
    sVar3 = cf2_hintmask_setCounts(hintMask,bitCount);
    if (sVar3 != 0) {
      for (uVar4 = 0; uVar4 < hintMask->byteCount; uVar4 = uVar4 + 1) {
        hintMask->mask[uVar4] = 0xff;
      }
      hintMask->mask[hintMask->byteCount - 1] =
           hintMask->mask[hintMask->byteCount - 1] & -1 << (-(char)bitCount & 7U);
    }
    if (hintMask->isValid == '\0') {
      if (font->isT1 == '\0') {
        return;
      }
      *hintMask->error = 0;
      pFVar7 = &hintmap->hinted;
      goto LAB_0020c240;
    }
  }
  hintmap->count = 0;
  hintmap->lastIndex = 0;
  auStack_f8 = (undefined1  [8])hintMask->error;
  tempHintMask.error = *(FT_Error **)&hintMask->isValid;
  tempHintMask._8_8_ = hintMask->bitCount;
  tempHintMask.bitCount = hintMask->byteCount;
  tempHintMask.byteCount = *(size_t *)hintMask->mask;
  tempHintMask.mask._0_8_ = *(undefined8 *)(hintMask->mask + 8);
  uVar4 = hStemHintArray->count;
  if (hintMask->bitCount < uVar4) {
    return;
  }
  if ((font->blues).doEmBoxHints != '\0') {
    dummy.index = 0;
    dummy.csCoord = 0;
    dummy.dsCoord = 0;
    auStack_88 = (undefined1  [8])0x0;
    dummy.flags = 0;
    dummy._4_4_ = 0;
    cf2_hintmap_insertHint(hintmap,&(font->blues).emBoxBottomEdge,(CF2_Hint)auStack_88);
    cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_88,&(font->blues).emBoxTopEdge);
  }
  psVar18 = &tempHintMask.byteCount;
  uVar19 = 0x80;
  for (sVar3 = 0; sVar3 != uVar4; sVar3 = sVar3 + 1) {
    if ((uVar19 & (byte)*psVar18) != 0) {
      topHintEdge._24_8_ = psVar18;
      cf2_hint_init((CF2_Hint)auStack_88,hStemHintArray,sVar3,font,hintOrigin,hintmap->scale,'\x01')
      ;
      psVar18 = (size_t *)topHintEdge._24_8_;
      cf2_hint_init((CF2_Hint)auStack_b8,hStemHintArray,sVar3,font,hintOrigin,hintmap->scale,'\0');
      if ((((ulong)auStack_88 & 0x10) == 0) && (((ulong)auStack_b8 & 0x10) == 0)) {
        iVar11 = (font->blues).blueFuzz;
        for (lVar15 = 0; (ulong)(font->blues).count * 0x14 - lVar15 != 0; lVar15 = lVar15 + 0x14) {
          if ((&(font->blues).zone[0].bottomZone)[lVar15] == '\0') {
            if (((((ulong)auStack_b8 & 10) != 0) &&
                (iVar2 = *(int *)((long)&(font->blues).zone[0].csBottomEdge + lVar15),
                iVar2 - iVar11 <= (int)topHintEdge.index)) &&
               ((int)topHintEdge.index <=
                *(int *)((long)&(font->blues).zone[0].csTopEdge + lVar15) + iVar11)) {
              if ((font->blues).suppressOvershoot == '\0') {
                uVar10 = topHintEdge.index._4_4_ + 0x8000U & 0xffff0000;
                if (((font->blues).blueShift <= (int)topHintEdge.index - iVar2) &&
                   (uVar13 = *(int *)((long)&(font->blues).zone[0].dsFlatEdge + lVar15) + 0x10000,
                   (int)uVar10 <= (int)uVar13)) {
                  uVar10 = uVar13;
                }
              }
              else {
                uVar10 = *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar15);
              }
              iVar11 = uVar10 - topHintEdge.index._4_4_;
              if (auStack_88._0_4_ != 0) goto LAB_0020bf31;
              goto LAB_0020bf47;
            }
          }
          else if (((((ulong)auStack_88 & 5) != 0) &&
                   (*(int *)((long)&(font->blues).zone[0].csBottomEdge + lVar15) - iVar11 <=
                    (int)dummy.index)) &&
                  (iVar2 = *(int *)((long)&(font->blues).zone[0].csTopEdge + lVar15),
                  (int)dummy.index <= iVar2 + iVar11)) {
            if ((font->blues).suppressOvershoot == '\0') {
              uVar10 = dummy.index._4_4_ + 0x8000U & 0xffff0000;
              if (((font->blues).blueShift <= iVar2 - (int)dummy.index) &&
                 (uVar13 = *(int *)((long)&(font->blues).zone[0].dsFlatEdge + lVar15) - 0x10000,
                 (int)uVar13 <= (int)uVar10)) {
                uVar10 = uVar13;
              }
            }
            else {
              uVar10 = *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar15);
            }
            iVar11 = uVar10 - dummy.index._4_4_;
LAB_0020bf31:
            dummy.index = CONCAT44(dummy.index._4_4_ + iVar11,(int)dummy.index);
            auStack_88 = (undefined1  [8])((ulong)auStack_88 | 0x10);
            if (auStack_b8._0_4_ != 0) {
LAB_0020bf47:
              topHintEdge.index = CONCAT44(topHintEdge.index._4_4_ + iVar11,(int)topHintEdge.index);
              auStack_b8 = (undefined1  [8])((ulong)auStack_b8 | 0x10);
            }
            goto LAB_0020bf5a;
          }
        }
      }
      else {
LAB_0020bf5a:
        cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_88,(CF2_Hint)auStack_b8);
        *(byte *)psVar18 = *(byte *)psVar18 & ~(byte)uVar19;
      }
    }
    uVar19 = uVar19 >> 1;
    bVar21 = (~(uint)sVar3 & 7) == 0;
    if (bVar21) {
      uVar19 = 0x80;
    }
    psVar18 = (size_t *)((long)psVar18 + (ulong)bVar21);
  }
  if (initialMap == '\0') {
    uVar19 = 0x80;
    psVar18 = &tempHintMask.byteCount;
    for (sVar3 = 0; uVar4 != sVar3; sVar3 = sVar3 + 1) {
      if ((uVar19 & (byte)*psVar18) != 0) {
        cf2_hint_init((CF2_Hint)auStack_88,hStemHintArray,sVar3,font,hintOrigin,hintmap->scale,
                      '\x01');
        cf2_hint_init((CF2_Hint)auStack_b8,hStemHintArray,sVar3,font,hintOrigin,hintmap->scale,'\0')
        ;
        cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_88,(CF2_Hint)auStack_b8);
      }
      uVar19 = uVar19 >> 1;
      bVar21 = (~(uint)sVar3 & 7) == 0;
      if (bVar21) {
        uVar19 = 0x80;
      }
      psVar18 = (size_t *)((long)psVar18 + (ulong)bVar21);
    }
  }
  else if (((hintmap->count == 0) || (0 < hintmap->edge[0].csCoord)) ||
          (hintmap->edge[hintmap->count - 1].csCoord < 0)) {
    dummy.flags = 0;
    dummy._4_4_ = 0;
    dummy.index = 0;
    auStack_88 = (undefined1  [8])0x31;
    dummy.dsCoord = 0;
    dummy.csCoord = hintmap->scale;
    auStack_b8 = (undefined1  [8])0x0;
    topHintEdge.flags = 0;
    topHintEdge._4_4_ = 0;
    topHintEdge.index = 0;
    topHintEdge.csCoord = 0;
    topHintEdge.dsCoord = 0;
    cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_88,(CF2_Hint)auStack_b8);
  }
  hintmap->hintMoves->count = 0;
  pCVar20 = hintmap->edge;
  uVar4 = 0;
  while (uVar4 < hintmap->count) {
    uVar19 = pCVar20[uVar4].flags;
    uVar1 = uVar4 + 1;
    uVar9 = uVar4;
    if ((uVar19 & 0xc) != 0) {
      uVar9 = uVar1;
    }
    if ((uVar19 & 0x10) == 0) {
      uVar10 = pCVar20[uVar4].dsCoord;
      uVar16 = uVar10 & 0xffff;
      uVar13 = hintmap->edge[uVar9].dsCoord;
      uVar14 = uVar13 & 0xffff;
      uVar17 = 0x10000 - uVar16;
      if (uVar16 == 0) {
        uVar17 = 0;
      }
      uVar12 = 0x10000 - uVar14;
      if (uVar14 == 0) {
        uVar12 = 0;
      }
      if (uVar17 < uVar12) {
        uVar12 = uVar17;
      }
      if (uVar16 < uVar14) {
        uVar14 = uVar16;
      }
      uVar17 = -uVar14;
      if ((uVar9 < hintmap->count - 1) &&
         (hintmap->edge[uVar9 + 1].dsCoord < (int)(uVar13 + uVar12 + 0x8000))) {
        if ((((uVar4 != 0) &&
             (uVar13 = 0, (int)((uVar10 - uVar14) + -0x8000) < pCVar20[uVar4 - 1].dsCoord)) ||
            (uVar13 = uVar17, uVar12 < uVar14)) && ((pCVar20[uVar9 + 1].flags & 0x10) == 0)) {
          dummy.flags = uVar12 - uVar13;
          topHintEdge.scale = uVar13;
          auStack_88 = (undefined1  [8])uVar9;
          cf2_arrstack_push(hintmap->hintMoves,auStack_88);
          uVar10 = pCVar20[uVar4].dsCoord;
          uVar13 = topHintEdge.scale;
        }
      }
      else if (((uVar4 == 0) ||
               (uVar13 = uVar12, pCVar20[uVar4 - 1].dsCoord <= (int)((uVar10 - uVar14) + -0x8000)))
              && (uVar13 = uVar17, uVar12 <= uVar14)) {
        uVar13 = uVar12;
      }
      pCVar20[uVar4].dsCoord = uVar10 + uVar13;
      if ((uVar19 & 0xc) != 0) {
        pCVar20[uVar9].dsCoord = pCVar20[uVar9].dsCoord + uVar13;
      }
    }
    if ((uVar4 != 0) && (iVar11 = pCVar20[uVar4].csCoord - pCVar20[uVar4 - 1].csCoord, iVar11 != 0))
    {
      FVar5 = FT_DivFix((long)(pCVar20[uVar4].dsCoord - pCVar20[uVar4 - 1].dsCoord),(long)iVar11);
      pCVar20[uVar4 - 1].scale = (CF2_F16Dot16)FVar5;
    }
    uVar9 = uVar4;
    if (((uVar19 & 0xc) != 0) &&
       (iVar11 = hintmap->edge[uVar4 + 1].csCoord - pCVar20[uVar4].csCoord, uVar9 = uVar1,
       iVar11 != 0)) {
      FVar5 = FT_DivFix((long)(pCVar20[uVar4 + 1].dsCoord - pCVar20[uVar4].dsCoord),(long)iVar11);
      pCVar20[uVar4].scale = (CF2_F16Dot16)FVar5;
    }
    uVar4 = uVar9 + 1;
  }
  sVar3 = hintmap->hintMoves->count;
  while (sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff) {
    plVar6 = (long *)cf2_arrstack_getPointer(hintmap->hintMoves,sVar3);
    lVar15 = *plVar6;
    iVar11 = hintmap->edge[lVar15].dsCoord;
    iVar2 = (int)plVar6[1];
    if ((iVar2 + iVar11 + 0x8000 <= hintmap->edge[lVar15 + 1].dsCoord) &&
       (pCVar20[lVar15].dsCoord = iVar11 + iVar2, (pCVar20[lVar15].flags & 0xc) != 0)) {
      pCVar20[lVar15 + -1].dsCoord = pCVar20[lVar15 + -1].dsCoord + iVar2;
    }
  }
  if (initialMap == '\0') {
    for (uVar4 = 0; uVar4 < hintmap->count; uVar4 = uVar4 + 1) {
      if ((pCVar20->flags & 0x20) == 0) {
        puVar8 = (undefined1 *)cf2_arrstack_getPointer(hStemHintArray,pCVar20->index);
        *(CF2_F16Dot16 *)(puVar8 + (ulong)((pCVar20->flags & 10) != 0) * 4 + 0xc) = pCVar20->dsCoord
        ;
        *puVar8 = 1;
      }
      pCVar20 = pCVar20 + 1;
    }
  }
  hintmap->isValid = '\x01';
  pFVar7 = &hintMask->isNew;
LAB_0020c240:
  *pFVar7 = '\0';
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_hintmap_build( CF2_HintMap   hintmap,
                     CF2_ArrStack  hStemHintArray,
                     CF2_ArrStack  vStemHintArray,
                     CF2_HintMask  hintMask,
                     CF2_Fixed     hintOrigin,
                     FT_Bool       initialMap )
  {
    FT_Byte*  maskPtr;

    CF2_Font         font = hintmap->font;
    CF2_HintMaskRec  tempHintMask;

    size_t   bitCount, i;
    FT_Byte  maskByte;


    /* check whether initial map is constructed */
    if ( !initialMap && !cf2_hintmap_isValid( hintmap->initialHintMap ) )
    {
      /* make recursive call with initialHintMap and temporary mask; */
      /* temporary mask will get all bits set, below */
      cf2_hintmask_init( &tempHintMask, hintMask->error );
      cf2_hintmap_build( hintmap->initialHintMap,
                         hStemHintArray,
                         vStemHintArray,
                         &tempHintMask,
                         hintOrigin,
                         TRUE );
    }

    if ( !cf2_hintmask_isValid( hintMask ) )
    {
      /* without a hint mask, assume all hints are active */
      cf2_hintmask_setAll( hintMask,
                           cf2_arrstack_size( hStemHintArray ) +
                             cf2_arrstack_size( vStemHintArray ) );
      if ( !cf2_hintmask_isValid( hintMask ) )
      {
        if ( font->isT1 )
        {
          /* no error, just continue unhinted */
          *hintMask->error = FT_Err_Ok;
          hintmap->hinted  = FALSE;
        }
        return;                   /* too many stem hints */
      }
    }

    /* begin by clearing the map */
    hintmap->count     = 0;
    hintmap->lastIndex = 0;

    /* make a copy of the hint mask so we can modify it */
    tempHintMask = *hintMask;
    maskPtr      = cf2_hintmask_getMaskPtr( &tempHintMask );

    /* use the hStem hints only, which are first in the mask */
    bitCount = cf2_arrstack_size( hStemHintArray );

    /* Defense-in-depth.  Should never return here. */
    if ( bitCount > hintMask->bitCount )
      return;

    /* synthetic embox hints get highest priority */
    if ( font->blues.doEmBoxHints )
    {
      CF2_HintRec  dummy;


      cf2_hint_initZero( &dummy );   /* invalid hint map element */

      /* ghost bottom */
      cf2_hintmap_insertHint( hintmap,
                              &font->blues.emBoxBottomEdge,
                              &dummy );
      /* ghost top */
      cf2_hintmap_insertHint( hintmap,
                              &dummy,
                              &font->blues.emBoxTopEdge );
    }

    /* insert hints captured by a blue zone or already locked (higher */
    /* priority)                                                      */
    for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
    {
      if ( maskByte & *maskPtr )
      {
        /* expand StemHint into two `CF2_Hint' elements */
        CF2_HintRec  bottomHintEdge, topHintEdge;


        cf2_hint_init( &bottomHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       TRUE /* bottom */ );
        cf2_hint_init( &topHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       FALSE /* top */ );

        if ( cf2_hint_isLocked( &bottomHintEdge ) ||
             cf2_hint_isLocked( &topHintEdge )    ||
             cf2_blues_capture( &font->blues,
                                &bottomHintEdge,
                                &topHintEdge )   )
        {
          /* insert captured hint into map */
          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );

          *maskPtr &= ~maskByte;      /* turn off the bit for this hint */
        }
      }

      if ( ( i & 7 ) == 7 )
      {
        /* move to next mask byte */
        maskPtr++;
        maskByte = 0x80;
      }
      else
        maskByte >>= 1;
    }

    /* initial hint map includes only captured hints plus maybe one at 0 */

    /*
     * TODO: There is a problem here because we are trying to build a
     *       single hint map containing all captured hints.  It is
     *       possible for there to be conflicts between captured hints,
     *       either because of darkening or because the hints are in
     *       separate hint zones (we are ignoring hint zones for the
     *       initial map).  An example of the latter is MinionPro-Regular
     *       v2.030 glyph 883 (Greek Capital Alpha with Psili) at 15ppem.
     *       A stem hint for the psili conflicts with the top edge hint
     *       for the base character.  The stem hint gets priority because
     *       of its sort order.  In glyph 884 (Greek Capital Alpha with
     *       Psili and Oxia), the top of the base character gets a stem
     *       hint, and the psili does not.  This creates different initial
     *       maps for the two glyphs resulting in different renderings of
     *       the base character.  Will probably defer this either as not
     *       worth the cost or as a font bug.  I don't think there is any
     *       good reason for an accent to be captured by an alignment
     *       zone.  -darnold 2/12/10
     */

    if ( initialMap )
    {
      /* Apply a heuristic that inserts a point for (0,0), unless it's     */
      /* already covered by a mapping.  This locks the baseline for glyphs */
      /* that have no baseline hints.                                      */

      if ( hintmap->count == 0                           ||
           hintmap->edge[0].csCoord > 0                  ||
           hintmap->edge[hintmap->count - 1].csCoord < 0 )
      {
        /* all edges are above 0 or all edges are below 0; */
        /* construct a locked edge hint at 0               */

        CF2_HintRec  edge, invalid;


        cf2_hint_initZero( &edge );

        edge.flags = CF2_GhostBottom |
                     CF2_Locked      |
                     CF2_Synthetic;
        edge.scale = hintmap->scale;

        cf2_hint_initZero( &invalid );
        cf2_hintmap_insertHint( hintmap, &edge, &invalid );
      }
    }
    else
    {
      /* insert remaining hints */

      maskPtr = cf2_hintmask_getMaskPtr( &tempHintMask );

      for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
      {
        if ( maskByte & *maskPtr )
        {
          CF2_HintRec  bottomHintEdge, topHintEdge;


          cf2_hint_init( &bottomHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         TRUE /* bottom */ );
          cf2_hint_init( &topHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         FALSE /* top */ );

          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );
        }

        if ( ( i & 7 ) == 7 )
        {
          /* move to next mask byte */
          maskPtr++;
          maskByte = 0x80;
        }
        else
          maskByte >>= 1;
      }
    }

    FT_TRACE6(( initialMap ? "flags: [p]air [g]host [t]op "
                             "[b]ottom [L]ocked [S]ynthetic\n"
                             "Initial hintmap\n"
                           : "Hints:\n" ));
    cf2_hintmap_dump( hintmap );

    /*
     * Note: The following line is a convenient place to break when
     *       debugging hinting.  Examine `hintmap->edge' for the list of
     *       enabled hints, then step over the call to see the effect of
     *       adjustment.  We stop here first on the recursive call that
     *       creates the initial map, and then on each counter group and
     *       hint zone.
     */

    /* adjust positions of hint edges that are not locked to blue zones */
    cf2_hintmap_adjustHints( hintmap );

    FT_TRACE6(( "(adjusted)\n" ));
    cf2_hintmap_dump( hintmap );

    /* save the position of all hints that were used in this hint map; */
    /* if we use them again, we'll locate them in the same position    */
    if ( !initialMap )
    {
      for ( i = 0; i < hintmap->count; i++ )
      {
        if ( !cf2_hint_isSynthetic( &hintmap->edge[i] ) )
        {
          /* Note: include both valid and invalid edges            */
          /* Note: top and bottom edges are copied back separately */
          CF2_StemHint  stemhint = (CF2_StemHint)
                          cf2_arrstack_getPointer( hStemHintArray,
                                                   hintmap->edge[i].index );


          if ( cf2_hint_isTop( &hintmap->edge[i] ) )
            stemhint->maxDS = hintmap->edge[i].dsCoord;
          else
            stemhint->minDS = hintmap->edge[i].dsCoord;

          stemhint->used = TRUE;
        }
      }
    }

    /* hint map is ready to use */
    hintmap->isValid = TRUE;

    /* remember this mask has been used */
    cf2_hintmask_setNew( hintMask, FALSE );
  }